

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O3

InstMeshInfo *
rw::ps2::getInstMeshInfo(InstMeshInfo *__return_storage_ptr__,MatPipeline *pipe,Geometry *g,Mesh *m)

{
  uint uVar1;
  uint uVar2;
  uint32 uVar3;
  uint32 uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint32 uVar8;
  uint uVar9;
  
  uVar8 = 0;
  lVar6 = 4;
  uVar4 = 0;
  uVar3 = 0;
  do {
    if (pipe->attribs[lVar6 + -4] != (PipeAttribute *)0x0) {
      uVar1 = pipe->attribs[lVar6 + -4]->attrib;
      if ((uVar1 & 6) == 0) {
        uVar4 = uVar4 + (((uVar1 >> 0x1a & 3) + 1) *
                         *(int *)(attribSize(unsigned_int)::size + (uVar1 >> 0x16 & 0xc)) >> 3);
        uVar3 = uVar3 + 1;
      }
      else {
        uVar8 = uVar8 + 1;
      }
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xe);
  __return_storage_ptr__->numBrokenAttribs = uVar8;
  __return_storage_ptr__->vertexSize = uVar4;
  __return_storage_ptr__->numAttribs = uVar3;
  uVar1 = m->numIndices;
  if (g->meshHeader->flags == 1) {
    uVar9 = pipe->triStripCount;
    uVar2 = (uVar1 - 2) / (uVar9 - 2);
    uVar7 = (uVar1 - 2) % (uVar9 - 2);
    __return_storage_ptr__->numBatches = uVar2;
    __return_storage_ptr__->batchVertCount = uVar9;
    if (uVar7 != 0) {
      uVar2 = uVar2 + 1;
      __return_storage_ptr__->numBatches = uVar2;
      uVar7 = uVar7 + 2;
      goto LAB_00127231;
    }
  }
  else {
    uVar9 = pipe->triListCount;
    uVar2 = ((uVar1 + uVar9) - 1) / uVar9;
    __return_storage_ptr__->numBatches = uVar2;
    __return_storage_ptr__->batchVertCount = uVar9;
    uVar7 = uVar1 % uVar9;
LAB_00127231:
    __return_storage_ptr__->lastBatchVertCount = uVar7;
    if (uVar7 != 0) goto LAB_0012723d;
  }
  __return_storage_ptr__->lastBatchVertCount = uVar9;
  uVar7 = uVar9;
LAB_0012723d:
  uVar3 = getBatchSize(pipe,uVar9);
  __return_storage_ptr__->batchSize = uVar3;
  uVar4 = getBatchSize(pipe,uVar7);
  __return_storage_ptr__->lastBatchSize = uVar4;
  if (uVar8 == 0) {
    iVar5 = uVar4 + (uVar2 - 1) * uVar3;
  }
  else {
    iVar5 = uVar4 + uVar8 * uVar2 * 2 + (uVar2 - 1) * (uVar3 + 1);
  }
  __return_storage_ptr__->size = iVar5 + 1U;
  lVar6 = 0;
  uVar8 = 0;
  do {
    if ((pipe->attribs[lVar6] != (PipeAttribute *)0x0) &&
       (uVar9 = pipe->attribs[lVar6]->attrib, (uVar9 & 6) != 0)) {
      __return_storage_ptr__->attribPos[lVar6] = iVar5 + 1U + uVar8;
      uVar8 = ((((uVar9 >> 0x1a & 3) + 1) *
                *(int *)(attribSize(unsigned_int)::size + (uVar9 >> 0x16 & 0xc)) >> 3) * uVar1 + 0xf
              >> 4) + uVar8;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10);
  __return_storage_ptr__->size2 = uVar8;
  return __return_storage_ptr__;
}

Assistant:

InstMeshInfo
getInstMeshInfo(MatPipeline *pipe, Geometry *g, Mesh *m)
{
	PipeAttribute *a;
	InstMeshInfo im;
	im.numAttribs = 0;
	im.numBrokenAttribs = 0;
	im.vertexSize = 0;
	for(uint i = 0; i < nelem(pipe->attribs); i++)
		if((a = pipe->attribs[i])) {
			if(a->attrib & AT_RW)
				im.numBrokenAttribs++;
			else{
				im.vertexSize += attribSize(a->attrib);
				im.numAttribs++;
			}
		}
	if(g->meshHeader->flags == MeshHeader::TRISTRIP){
		im.numBatches = (m->numIndices-2) / (pipe->triStripCount-2);
		im.batchVertCount = pipe->triStripCount;
		im.lastBatchVertCount = (m->numIndices-2) % (pipe->triStripCount-2);
		if(im.lastBatchVertCount){
			im.numBatches++;
			im.lastBatchVertCount += 2;
		}
	}else{	// TRILIST; nothing else supported yet
		im.numBatches = (m->numIndices+pipe->triListCount-1) /
		                 pipe->triListCount;
		im.batchVertCount = pipe->triListCount;
		im.lastBatchVertCount = m->numIndices % pipe->triListCount;
	}
	if(im.lastBatchVertCount == 0)
		im.lastBatchVertCount = im.batchVertCount;

	im.batchSize = getBatchSize(pipe, im.batchVertCount);
	im.lastBatchSize = getBatchSize(pipe, im.lastBatchVertCount);
	if(im.numBrokenAttribs == 0)
		im.size = 1 + im.batchSize*(im.numBatches-1) + im.lastBatchSize;
	else
		im.size = 2*im.numBrokenAttribs*im.numBatches +
		          (1+im.batchSize)*(im.numBatches-1) + 1+im.lastBatchSize;

	/* figure out size and addresses of broken out sections */
	im.size2 = 0;
	for(uint i = 0; i < nelem(im.attribPos); i++)
		if((a = pipe->attribs[i]) && a->attrib & AT_RW){
			im.attribPos[i] = im.size2 + im.size;
			im.size2 += QWC(m->numIndices*attribSize(a->attrib));
		}

	return im;
}